

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetSingleFileBuildCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_260 [32];
  undefined1 local_240 [8];
  ostringstream ss;
  allocator local_c2;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string generator;
  allocator local_69;
  string local_68;
  string local_48 [8];
  string make;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  string *buildCommand;
  
  make.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_MAKE_PROGRAM",&local_69);
  pcVar2 = cmMakefile::GetRequiredDefinition(mf,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar2,(allocator *)(generator.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(generator.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"CMAKE_GENERATOR",&local_c1);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_a0,pcVar2,&local_c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,"Unix Makefiles");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"MinGW Makefiles"), bVar1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    poVar3 = std::operator<<((ostream *)local_240,local_48);
    std::operator<<(poVar3," -f$(ProjectPath)/Makefile $(CurrentFileName).cpp.o");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_260);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  }
  make.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_48);
  if ((make.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetSingleFileBuildCommand(
  const cmMakefile* mf) const
{
  std::string buildCommand;
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  if (generator == "Unix Makefiles" || generator == "MinGW Makefiles") {
    std::ostringstream ss;
    ss << make << " -f$(ProjectPath)/Makefile $(CurrentFileName).cpp.o";
    buildCommand = ss.str();
  }
  return buildCommand;
}